

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

Vec_Wec_t * Abc_NtkDetectObjClasses(Abc_Ntk_t *pNtk,Vec_Int_t *vObjs,Vec_Wec_t **pvCos)

{
  int iVar1;
  uint uVar2;
  int i_00;
  int iVar3;
  Hsh_VecMan_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar4;
  Abc_Obj_t *pAVar5;
  Vec_Wec_t *p_01;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *vVec1;
  Vec_Int_t *vSet;
  Vec_Int_t *vMap;
  Hsh_VecMan_t *pHash;
  int ClassId;
  int SetId;
  int iObj;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vClass;
  Vec_Int_t *vClassMap;
  Vec_Wec_t *vClasses;
  Vec_Wec_t **pvCos_local;
  Vec_Int_t *vObjs_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Hsh_VecManStart(1000);
  iVar1 = Abc_NtkObjNumMax(pNtk);
  p_00 = Vec_IntStartFull(iVar1);
  pVVar4 = Vec_IntAlloc(0x10);
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                  ,0x193,
                  "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
  }
  iVar1 = Hsh_VecManAdd(p,pVVar4);
  if (iVar1 == 0) {
    for (SetId = 0; iVar1 = Abc_NtkCoNum(pNtk), SetId < iVar1; SetId = SetId + 1) {
      pAVar5 = Abc_NtkCo(pNtk,SetId);
      uVar2 = Abc_ObjId(pAVar5);
      Vec_IntFill(pVVar4,1,uVar2);
      iVar1 = Hsh_VecManAdd(p,pVVar4);
      uVar2 = Abc_ObjId(pAVar5);
      Vec_IntWriteEntry(p_00,uVar2,iVar1);
    }
    Vec_IntSort(vObjs,0);
    for (SetId = 0; iVar1 = Vec_IntSize(vObjs), SetId < iVar1; SetId = SetId + 1) {
      iVar1 = Vec_IntEntry(vObjs,SetId);
      pAVar5 = Abc_NtkObj(pNtk,iVar1);
      if (pAVar5 != (Abc_Obj_t *)0x0) {
        Abc_NtkDetectObjClasses_rec(pAVar5,p_00,p,pVVar4);
      }
    }
    Vec_IntFree(pVVar4);
    iVar1 = Hsh_VecSize(p);
    pVVar4 = Vec_IntStartFull(iVar1 + 1);
    p_01 = Vec_WecAlloc(1000);
    for (SetId = 0; iVar1 = Vec_IntSize(vObjs), SetId < iVar1; SetId = SetId + 1) {
      iVar1 = Vec_IntEntry(vObjs,SetId);
      i_00 = Vec_IntEntry(p_00,iVar1);
      if (i_00 < 0) {
        __assert_fail("SetId >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                      ,0x1ac,
                      "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
      }
      iVar3 = Vec_IntEntry(pVVar4,i_00);
      if (iVar3 == -1) {
        iVar3 = Vec_WecSize(p_01);
        Vec_IntWriteEntry(pVVar4,i_00,iVar3);
        pObj = (Abc_Obj_t *)Vec_WecPushLevel(p_01);
      }
      else {
        pObj = (Abc_Obj_t *)Vec_WecEntry(p_01,iVar3);
      }
      Vec_IntPush((Vec_Int_t *)pObj,iVar1);
    }
    iVar1 = Vec_WecSize(p_01);
    pVVar6 = Vec_WecStart(iVar1);
    *pvCos = pVVar6;
    SetId = 0;
    while( true ) {
      iVar1 = Vec_WecSize(p_01);
      if (iVar1 <= SetId) {
        Hsh_VecManStop(p);
        Vec_IntFree(pVVar4);
        Vec_IntFree(p_00);
        return p_01;
      }
      pVVar7 = Vec_WecEntry(p_01,SetId);
      iVar1 = Vec_IntEntry(pVVar7,0);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      if (iVar1 < 0) break;
      pVVar7 = Hsh_VecReadEntry(p,iVar1);
      vVec1 = Vec_WecEntry(*pvCos,SetId);
      Vec_IntAppend(vVec1,pVVar7);
      SetId = SetId + 1;
    }
    __assert_fail("SetId >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                  ,0x1c4,
                  "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
  }
  __assert_fail("SetId == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                ,0x196,"Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)")
  ;
}

Assistant:

Vec_Wec_t * Abc_NtkDetectObjClasses( Abc_Ntk_t * pNtk, Vec_Int_t * vObjs, Vec_Wec_t ** pvCos )
{
    Vec_Wec_t * vClasses;   // classes of equivalence objects from vObjs
    Vec_Int_t * vClassMap;  // mapping of each CO set into its class in vClasses
    Vec_Int_t * vClass;     // one equivalence class     
    Abc_Obj_t * pObj; 
    int i, iObj, SetId, ClassId;
    // create hash table to hash sets of CO indexes
    Hsh_VecMan_t * pHash = Hsh_VecManStart( 1000 );
    // create elementary sets (each composed of one CO) and map COs into them
    Vec_Int_t * vMap = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Vec_Int_t * vSet = Vec_IntAlloc( 16 );
    assert( Abc_NtkIsLogic(pNtk) );
    // compute empty set
    SetId = Hsh_VecManAdd( pHash, vSet );
    assert( SetId == 0 );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Vec_IntFill( vSet, 1, Abc_ObjId(pObj) );
        SetId = Hsh_VecManAdd( pHash, vSet );
        Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), SetId );
    }
    // make sure the array of objects is sorted
    Vec_IntSort( vObjs, 0 );
    // begin from the objects and map their IDs into sets of COs
    Abc_NtkForEachObjVec( vObjs, pNtk, pObj, i )
        Abc_NtkDetectObjClasses_rec( pObj, vMap, pHash, vSet );
    Vec_IntFree( vSet );
    // create map for mapping CO set its their classes
    vClassMap = Vec_IntStartFull( Hsh_VecSize(pHash) + 1 );
    // collect classes of objects
    vClasses = Vec_WecAlloc( 1000 );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        //char * pName = Abc_ObjName( Abc_NtkObj(pNtk, iObj) );
        // for a given object (iObj), find the ID of its COs set
        SetId = Vec_IntEntry( vMap, iObj );
        assert( SetId >= 0 );
        // for the given CO set, finds its equivalence class
        ClassId = Vec_IntEntry( vClassMap, SetId );
        if ( ClassId == -1 )  // there is no equivalence class
        {
            // map this CO set into a new equivalence class
            Vec_IntWriteEntry( vClassMap, SetId, Vec_WecSize(vClasses) );
            vClass = Vec_WecPushLevel( vClasses );
        }
        else // get hold of the equivalence class
            vClass = Vec_WecEntry( vClasses, ClassId );
        // add objects to the class
        Vec_IntPush( vClass, iObj );
        // print the set for this object
        //printf( "Object %5d : ", iObj );
        //Vec_IntPrint( Hsh_VecReadEntry(pHash, SetId) );
    }
    // collect arrays of COs for each class
    *pvCos = Vec_WecStart( Vec_WecSize(vClasses) );
    Vec_WecForEachLevel( vClasses, vClass, i )
    {
        iObj = Vec_IntEntry( vClass, 0 );
        // for a given object (iObj), find the ID of its COs set
        SetId = Vec_IntEntry( vMap, iObj );
        assert( SetId >= 0 );
        // for the given CO set ID, find the set
        vSet = Hsh_VecReadEntry( pHash, SetId );
        Vec_IntAppend( Vec_WecEntry(*pvCos, i), vSet );
    }
    Hsh_VecManStop( pHash );
    Vec_IntFree( vClassMap );
    Vec_IntFree( vMap );
    return vClasses;
}